

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O1

void __thiscall
Diffusion::diffuse_Vsync
          (Diffusion *this,MultiFab *Vsync,Real dt,Real be_cn_theta,MultiFab *rho_half,int rho_flag,
          MultiFab **beta,int betaComp,bool update_fluxreg)

{
  NavierStokesBase *pNVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  StateDescriptor *this_00;
  BCRec *pBVar5;
  int k;
  long lVar6;
  int n;
  int i;
  Box top_strip;
  Box result;
  int allthere;
  int local_a0 [3];
  IntVect local_94;
  Box local_88;
  int local_68 [6];
  undefined4 uStack_50;
  Real local_48;
  Real local_40;
  int local_34;
  
  local_48 = dt;
  local_40 = be_cn_theta;
  checkBeta(this,beta,&local_34);
  diffuse_tensor_Vsync(this,Vsync,local_48,local_40,rho_half,rho_flag,beta,betaComp,update_fluxreg);
  pNVar1 = this->navier_stokes;
  uVar2 = *(undefined8 *)(pNVar1->super_AmrLevel).geom.domain.smallend.vect;
  uVar3 = *(undefined8 *)((pNVar1->super_AmrLevel).geom.domain.smallend.vect + 2);
  uVar4 = *(undefined8 *)((pNVar1->super_AmrLevel).geom.domain.bigend.vect + 2);
  local_68[4] = (int)((ulong)*(undefined8 *)(pNVar1->super_AmrLevel).geom.domain.bigend.vect >> 0x20
                     );
  local_68[5] = (int)uVar4;
  uStack_50 = (undefined4)((ulong)uVar4 >> 0x20);
  local_68[2] = (int)uVar3;
  local_68[3] = (int)((ulong)uVar3 >> 0x20);
  local_68[0] = (int)uVar2;
  local_68[1] = (int)((ulong)uVar2 >> 0x20);
  local_68[2] = local_68[2] + -1;
  local_68[3] = local_68[3] + 1;
  local_68[1] = local_68[1] + -1;
  local_68[0] = local_68[0] + -1;
  local_68[4] = local_68[4] + 1;
  local_68[5] = local_68[5] + 1;
  i = 0;
  do {
    this_00 = amrex::DescriptorList::operator[]((DescriptorList *)amrex::AmrLevel::desc_lst,0);
    pBVar5 = amrex::StateDescriptor::getBC(this_00,i);
    lVar6 = 0;
    do {
      if (pBVar5->bc[lVar6 + 3] == 3) {
        local_a0[2] = local_68[2];
        local_a0[0] = local_68[0];
        local_a0[1] = local_68[1];
        local_a0[lVar6] = local_68[lVar6 + 3];
        local_88.smallend.vect[2] = local_a0[2];
        local_88.smallend.vect[0] = local_a0[0];
        local_88.smallend.vect[1] = local_a0[1];
        local_88.bigend.vect[2] = local_68[5];
        local_88.bigend.vect[1] = local_68[4];
        local_88.bigend.vect[0] = local_68[3];
        local_88.btype.itype = 0;
        local_94.vect[0] = 1;
        local_94.vect[1] = 1;
        local_94.vect[2] = 1;
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&Vsync->super_FabArray<amrex::FArrayBox>,0.0,&local_88,i,1,&local_94);
      }
      if (pBVar5->bc[lVar6] == 3) {
        local_a0[2] = local_68[5];
        local_a0[1] = local_68[4];
        local_a0[0] = local_68[3];
        local_a0[lVar6] = local_68[lVar6];
        local_88.smallend.vect[2] = local_68[2];
        local_88.smallend.vect[0] = local_68[0];
        local_88.smallend.vect[1] = local_68[1];
        local_88.bigend.vect[2] = local_a0[2];
        local_88.bigend.vect[0] = local_a0[0];
        local_88.bigend.vect[1] = local_a0[1];
        local_88.btype.itype = 0;
        local_94.vect[0] = 1;
        local_94.vect[1] = 1;
        local_94.vect[2] = 1;
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&Vsync->super_FabArray<amrex::FArrayBox>,0.0,&local_88,i,1,&local_94);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    i = i + 1;
  } while (i != 3);
  return;
}

Assistant:

void
Diffusion::diffuse_Vsync (MultiFab&              Vsync,
                          Real                   dt,
                          Real                   be_cn_theta,
                          const MultiFab&        rho_half,
                          int                    rho_flag,
                          const MultiFab* const* beta,
                          int                    betaComp,
                          bool                   update_fluxreg)
{
    BL_ASSERT(rho_flag == 1|| rho_flag == 3);

    int allthere;
    checkBeta(beta, allthere);

#ifdef AMREX_DEBUG
    for (int d = 0; d < AMREX_SPACEDIM; ++d)
        BL_ASSERT(beta[d]->min(0,0) >= 0.0);
#endif

    diffuse_tensor_Vsync(Vsync,dt,be_cn_theta,rho_half,rho_flag,beta,betaComp,update_fluxreg);
    //
    // applyBC has put "incorrect" values in the ghost cells
    // outside external Dirichlet boundaries. Reset these to zero
    // so that syncproject and conservative interpolation works correctly.
    //
    Box domain = amrex::grow(navier_stokes->Geom().Domain(),1);

    for (int n = Xvel; n < Xvel+AMREX_SPACEDIM; n++)
    {
        const BCRec& velbc = navier_stokes->get_desc_lst()[State_Type].getBC(n);

        for (int k = 0; k < AMREX_SPACEDIM; k++)
        {
            if (velbc.hi(k) == EXT_DIR)
            {
                IntVect smallend = domain.smallEnd();
                smallend.setVal(k,domain.bigEnd(k));
                Box top_strip(smallend,domain.bigEnd(),IntVect::TheCellVector());
                Vsync.setVal(0,top_strip,n-Xvel,1,1);
            }
            if (velbc.lo(k) == EXT_DIR)
            {
                IntVect bigend = domain.bigEnd();
                bigend.setVal(k,domain.smallEnd(k));
                Box bottom_strip(domain.smallEnd(),bigend,IntVect::TheCellVector());
                Vsync.setVal(0,bottom_strip,n-Xvel,1,1);
            }
        }
    }
}